

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_curve25519.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *__format;
  char pers [5];
  uchar srv_to_cli [32];
  uchar cli_to_srv [32];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_ecdh_context ctx_srv;
  mbedtls_ecdh_context ctx_cli;
  mbedtls_entropy_context entropy;
  uchar local_aa0 [8];
  uchar local_a98 [32];
  uchar local_a78 [32];
  mbedtls_ctr_drbg_context local_a58;
  mbedtls_ecdh_context local_900;
  mbedtls_ecdh_context local_698;
  mbedtls_entropy_context local_430;
  
  builtin_memcpy(local_aa0,"ecdh",5);
  mbedtls_ecdh_init(&local_698);
  mbedtls_ecdh_init(&local_900);
  mbedtls_ctr_drbg_init(&local_a58);
  printf("  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&local_430);
  uVar1 = mbedtls_ctr_drbg_seed(&local_a58,mbedtls_entropy_func,&local_430,local_aa0,5);
  if (uVar1 == 0) {
    puts(" ok");
    printf("  . Setting up client context...");
    fflush(_stdout);
    uVar1 = mbedtls_ecp_group_load(&local_698.grp,MBEDTLS_ECP_DP_CURVE25519);
    if (uVar1 == 0) {
      uVar1 = mbedtls_ecdh_gen_public
                        (&local_698.grp,&local_698.d,&local_698.Q,mbedtls_ctr_drbg_random,&local_a58
                        );
      if (uVar1 == 0) {
        uVar1 = mbedtls_mpi_write_binary(&local_698.Q.X,local_a78,0x20);
        if (uVar1 == 0) {
          puts(" ok");
          printf("  . Setting up server context...");
          fflush(_stdout);
          uVar1 = mbedtls_ecp_group_load(&local_900.grp,MBEDTLS_ECP_DP_CURVE25519);
          if (uVar1 != 0) goto LAB_001043a4;
          uVar1 = mbedtls_ecdh_gen_public
                            (&local_900.grp,&local_900.d,&local_900.Q,mbedtls_ctr_drbg_random,
                             &local_a58);
          if (uVar1 != 0) goto LAB_001043e0;
          uVar1 = mbedtls_mpi_write_binary(&local_900.Q.X,local_a98,0x20);
          if (uVar1 == 0) {
            puts(" ok");
            printf("  . Server reading client key and computing secret...");
            fflush(_stdout);
            uVar1 = mbedtls_mpi_lset(&local_900.Qp.Z,1);
            if (uVar1 == 0) {
              uVar1 = mbedtls_mpi_read_binary(&local_900.Qp.X,local_a78,0x20);
              if (uVar1 != 0) {
LAB_00104549:
                __format = " failed\n  ! mbedtls_mpi_read_binary returned %d\n";
                goto LAB_00104406;
              }
              uVar1 = mbedtls_ecdh_compute_shared
                                (&local_900.grp,&local_900.z,&local_900.Qp,&local_900.d,
                                 mbedtls_ctr_drbg_random,&local_a58);
              if (uVar1 == 0) {
                puts(" ok");
                printf("  . Client reading server key and computing secret...");
                fflush(_stdout);
                uVar1 = mbedtls_mpi_lset(&local_698.Qp.Z,1);
                if (uVar1 != 0) goto LAB_0010451f;
                uVar1 = mbedtls_mpi_read_binary(&local_698.Qp.X,local_a98,0x20);
                if (uVar1 != 0) goto LAB_00104549;
                uVar1 = mbedtls_ecdh_compute_shared
                                  (&local_698.grp,&local_698.z,&local_698.Qp,&local_698.d,
                                   mbedtls_ctr_drbg_random,&local_a58);
                if (uVar1 == 0) {
                  puts(" ok");
                  iVar2 = 0;
                  printf("  . Checking if both computed secrets are equal...");
                  fflush(_stdout);
                  uVar1 = mbedtls_mpi_cmp_mpi(&local_698.z,&local_900.z);
                  if (uVar1 == 0) {
                    puts(" ok");
                    goto LAB_00104414;
                  }
                }
              }
              __format = " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n";
            }
            else {
LAB_0010451f:
              __format = " failed\n  ! mbedtls_mpi_lset returned %d\n";
            }
            goto LAB_00104406;
          }
        }
        __format = " failed\n  ! mbedtls_mpi_write_binary returned %d\n";
      }
      else {
LAB_001043e0:
        __format = " failed\n  ! mbedtls_ecdh_gen_public returned %d\n";
      }
    }
    else {
LAB_001043a4:
      __format = " failed\n  ! mbedtls_ecp_group_load returned %d\n";
    }
  }
  else {
    __format = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
  }
LAB_00104406:
  printf(__format,(ulong)uVar1);
  iVar2 = 1;
LAB_00104414:
  mbedtls_ecdh_free(&local_900);
  mbedtls_ecdh_free(&local_698);
  mbedtls_ctr_drbg_free(&local_a58);
  mbedtls_entropy_free(&local_430);
  return iVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_ecdh_context ctx_cli, ctx_srv;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char cli_to_srv[32], srv_to_cli[32];
    const char pers[] = "ecdh";
    ((void) argc);
    ((void) argv);

    mbedtls_ecdh_init( &ctx_cli );
    mbedtls_ecdh_init( &ctx_srv );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * Initialize random number generation
     */
    mbedtls_printf( "  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               sizeof pers ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Client: inialize context and generate keypair
     */
    mbedtls_printf( "  . Setting up client context..." );
    fflush( stdout );

    ret = mbedtls_ecp_group_load( &ctx_cli.grp, MBEDTLS_ECP_DP_CURVE25519 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_load returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_gen_public( &ctx_cli.grp, &ctx_cli.d, &ctx_cli.Q,
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_gen_public returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_write_binary( &ctx_cli.Q.X, cli_to_srv, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_binary returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Server: initialize context and generate keypair
     */
    mbedtls_printf( "  . Setting up server context..." );
    fflush( stdout );

    ret = mbedtls_ecp_group_load( &ctx_srv.grp, MBEDTLS_ECP_DP_CURVE25519 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_load returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_gen_public( &ctx_srv.grp, &ctx_srv.d, &ctx_srv.Q,
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_gen_public returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_write_binary( &ctx_srv.Q.X, srv_to_cli, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_binary returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Server: read peer's key and generate shared secret
     */
    mbedtls_printf( "  . Server reading client key and computing secret..." );
    fflush( stdout );

    ret = mbedtls_mpi_lset( &ctx_srv.Qp.Z, 1 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_lset returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_read_binary( &ctx_srv.Qp.X, cli_to_srv, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_binary returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_compute_shared( &ctx_srv.grp, &ctx_srv.z,
                                       &ctx_srv.Qp, &ctx_srv.d,
                                       mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Client: read peer's key and generate shared secret
     */
    mbedtls_printf( "  . Client reading server key and computing secret..." );
    fflush( stdout );

    ret = mbedtls_mpi_lset( &ctx_cli.Qp.Z, 1 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_lset returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_read_binary( &ctx_cli.Qp.X, srv_to_cli, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_binary returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_compute_shared( &ctx_cli.grp, &ctx_cli.z,
                                       &ctx_cli.Qp, &ctx_cli.d,
                                       mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Verification: are the computed secrets equal?
     */
    mbedtls_printf( "  . Checking if both computed secrets are equal..." );
    fflush( stdout );

    ret = mbedtls_mpi_cmp_mpi( &ctx_cli.z, &ctx_srv.z );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    mbedtls_ecdh_free( &ctx_srv );
    mbedtls_ecdh_free( &ctx_cli );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

    return( exit_code );
}